

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

void __thiscall
pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::InlinedVector
          (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *this,
          InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *other,
          polymorphic_allocator<float> *alloc)

{
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *pIVar1;
  iterator pfVar2;
  const_reference args;
  size_t sVar3;
  undefined8 *in_RDX;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *in_RSI;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *in_RDI;
  size_t i;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *this_00;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *local_20;
  
  (in_RDI->alloc).memoryResource = (memory_resource *)*in_RDX;
  in_RDI->ptr = (float *)0x0;
  in_RDI->nAlloc = 0;
  in_RDI->nStored = 0;
  size(in_RSI);
  reserve(in_RSI,(size_t)in_RDX);
  local_20 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)0x0;
  while( true ) {
    this_00 = local_20;
    pIVar1 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)size(in_RSI);
    if (pIVar1 <= this_00) break;
    pfVar2 = begin(in_RDI);
    pfVar2 = pfVar2 + (long)local_20;
    args = operator[](this_00,(size_type)pfVar2);
    pstd::pmr::polymorphic_allocator<float>::construct<float,float_const&>
              (&in_RDI->alloc,pfVar2,args);
    local_20 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
               ((long)&(local_20->alloc).memoryResource + 1);
  }
  sVar3 = size(in_RSI);
  in_RDI->nStored = sVar3;
  return;
}

Assistant:

InlinedVector(const InlinedVector &other, const Allocator &alloc = {})
        : alloc(alloc) {
        reserve(other.size());
        for (size_t i = 0; i < other.size(); ++i)
            this->alloc.template construct<T>(begin() + i, other[i]);
        nStored = other.size();
    }